

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>,true>
          (Thread *this)

{
  undefined1 auVar1 [12];
  ulong uVar2;
  undefined1 auVar3 [16];
  Value VVar6;
  Value value;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  VVar6 = Pop(this);
  uVar2 = VVar6.i64_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5._12_2_ = VVar6._6_2_;
  auVar5._14_2_ = VVar6._6_2_;
  auVar4._12_4_ = auVar5._12_4_;
  auVar4._8_2_ = 0;
  auVar4._0_8_ = uVar2;
  auVar4._10_2_ = VVar6._4_2_;
  auVar3._10_6_ = auVar4._10_6_;
  auVar3._8_2_ = VVar6._4_2_;
  auVar3._0_8_ = uVar2;
  auVar1._4_8_ = auVar3._8_8_;
  auVar1._2_2_ = VVar6._2_2_;
  auVar1._0_2_ = VVar6._2_2_;
  value.i64_._4_4_ = auVar1._0_4_ >> 0x10;
  value.i32_ = (int)VVar6._0_2_;
  value._12_4_ = auVar4._12_4_ >> 0x10;
  value._8_4_ = auVar3._8_4_ >> 0x10;
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}